

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int CalcRoutingScore(ImGuiWindow *location,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiWindow *local_38;
  int next_score;
  ImGuiWindow *focused;
  ImGuiContext *g;
  ImGuiInputFlags flags_local;
  ImGuiID owner_id_local;
  ImGuiWindow *location_local;
  int local_4;
  
  if ((flags & 0x100U) == 0) {
    if ((flags & 0x400U) == 0) {
      if ((flags & 0x200U) == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 0xfe;
      }
    }
    else {
      local_4 = 2;
    }
  }
  else {
    focused = GImGui->NavWindow;
    if ((owner_id == 0) || (GImGui->ActiveId != owner_id)) {
      if ((focused != (ImGuiWindow *)0x0) && (focused->RootWindow == location->RootWindow)) {
        next_score = 3;
        while (focused != (ImGuiWindow *)0x0) {
          if (focused == location) {
            return next_score;
          }
          if (focused->RootWindow == focused) {
            local_38 = (ImGuiWindow *)0x0;
          }
          else {
            local_38 = focused->ParentWindow;
          }
          next_score = next_score + 1;
          focused = local_38;
        }
      }
      local_4 = 0xff;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int CalcRoutingScore(ImGuiWindow* location, ImGuiID owner_id, ImGuiInputFlags flags)
{
    if (flags & ImGuiInputFlags_RouteFocused)
    {
        ImGuiContext& g = *GImGui;
        ImGuiWindow* focused = g.NavWindow;

        // ActiveID gets top priority
        // (we don't check g.ActiveIdUsingAllKeys here. Routing is applied but if input ownership is tested later it may discard it)
        if (owner_id != 0 && g.ActiveId == owner_id)
            return 1;

        // Score based on distance to focused window (lower is better)
        // Assuming both windows are submitting a routing request,
        // - When Window....... is focused -> Window scores 3 (best), Window/ChildB scores 255 (no match)
        // - When Window/ChildB is focused -> Window scores 4,        Window/ChildB scores 3 (best)
        // Assuming only WindowA is submitting a routing request,
        // - When Window/ChildB is focused -> Window scores 4 (best), Window/ChildB doesn't have a score.
        if (focused != NULL && focused->RootWindow == location->RootWindow)
            for (int next_score = 3; focused != NULL; next_score++)
            {
                if (focused == location)
                {
                    IM_ASSERT(next_score < 255);
                    return next_score;
                }
                focused = (focused->RootWindow != focused) ? focused->ParentWindow : NULL; // FIXME: This could be later abstracted as a focus path
            }
        return 255;
    }

    // ImGuiInputFlags_RouteGlobalHigh is default, so calls without flags are not conditional
    if (flags & ImGuiInputFlags_RouteGlobal)
        return 2;
    if (flags & ImGuiInputFlags_RouteGlobalLow)
        return 254;
    return 0;
}